

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O1

int arkSetMaxGrowth(void *arkode_mem,realtype mx_growth)

{
  int iVar1;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem ark_mem;
  ARKodeHAdaptMem local_20;
  double local_18;
  ARKodeMem local_8;
  
  local_18 = mx_growth;
  iVar1 = arkAccessHAdaptMem(arkode_mem,"arkSetMaxGrowth",&local_8,&local_20);
  if (iVar1 == 0) {
    local_20->growth =
         (realtype)
         (~-(ulong)(1.0 < local_18) & 0x4034000000000000 |
         (ulong)local_18 & -(ulong)(1.0 < local_18));
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int arkSetMaxGrowth(void *arkode_mem, realtype mx_growth)
{
  int retval;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem ark_mem;
  retval = arkAccessHAdaptMem(arkode_mem, "arkSetMaxGrowth",
                              &ark_mem, &hadapt_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* set allowed value, otherwise set default */
  if (mx_growth <= ONE) {
    hadapt_mem->growth = GROWTH;
  } else {
    hadapt_mem->growth = mx_growth;
  }

  return(ARK_SUCCESS);
}